

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_definitions.hpp
# Opt level: O0

double units::detail::convertFlaggedUnits<units::precise_unit,units::precise_unit>
                 (double val,precise_unit *start,precise_unit *result,double basis)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  precise_unit *in_RSI;
  precise_unit *in_RDI;
  double in_XMM0_Qa;
  double dVar4;
  double dVar5;
  double dVar6;
  double in_XMM1_Qa;
  precise_unit *in_stack_ffffffffffffff58;
  precise_unit *in_stack_ffffffffffffff60;
  unit_data base;
  precise_unit *in_stack_ffffffffffffffa8;
  precise_unit *in_stack_ffffffffffffffb0;
  double in_stack_ffffffffffffffb8;
  
  bVar1 = is_temperature(in_stack_ffffffffffffff60);
  if (!bVar1) {
    bVar1 = is_temperature(in_stack_ffffffffffffff60);
    base = SUB84((ulong)in_stack_ffffffffffffff60 >> 0x20,0);
    if (!bVar1) {
      precise_unit::base_units((precise_unit *)precise::pressure::psi);
      bVar1 = precise_unit::has_same_base(in_stack_ffffffffffffff58,base);
      if (!bVar1) {
        return NAN;
      }
      bVar1 = precise_unit::has_e_flag((precise_unit *)0x5bc82a);
      bVar2 = precise_unit::has_e_flag((precise_unit *)0x5bc840);
      if (bVar1 == bVar2) {
        dVar4 = precise_unit::multiplier(in_RDI);
        dVar4 = in_XMM0_Qa * dVar4;
        dVar5 = precise_unit::multiplier(in_RSI);
        return dVar4 / dVar5;
      }
      bVar1 = precise_unit::has_e_flag((precise_unit *)0x5bc8b4);
      if (bVar1) {
        uVar3 = std::isnan(in_XMM1_Qa);
        if ((uVar3 & 1) == 0) {
          dVar4 = precise_unit::multiplier(in_RDI);
          dVar5 = precise_unit::multiplier(in_RSI);
          return ((in_XMM0_Qa + in_XMM1_Qa) * dVar4) / dVar5;
        }
        dVar4 = precise_unit::multiplier(in_RDI);
        dVar5 = precise_unit::multiplier((precise_unit *)precise::pressure::atm);
        dVar5 = in_XMM0_Qa * dVar4 + dVar5;
        dVar4 = precise_unit::multiplier(in_RSI);
        return dVar5 / dVar4;
      }
      uVar3 = std::isnan(in_XMM1_Qa);
      if ((uVar3 & 1) == 0) {
        dVar4 = precise_unit::multiplier(in_RDI);
        dVar5 = precise_unit::multiplier(in_RSI);
        return (in_XMM0_Qa * dVar4) / dVar5 - in_XMM1_Qa;
      }
      dVar4 = precise_unit::multiplier(in_RDI);
      dVar5 = precise_unit::multiplier((precise_unit *)precise::pressure::atm);
      dVar6 = precise_unit::multiplier(in_RSI);
      return (in_XMM0_Qa * dVar4 + -dVar5) / dVar6;
    }
  }
  dVar4 = convertTemperature<units::precise_unit,units::precise_unit>
                    (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  return dVar4;
}

Assistant:

double convertFlaggedUnits(
        double val,
        const UX& start,
        const UX2& result,
        double basis = constants::invalid_conversion)
    {
        if (is_temperature(start) || is_temperature(result)) {
            return convertTemperature(val, start, result);
        }
        if (start.has_same_base(precise::pressure::psi.base_units())) {
            if (start.has_e_flag() == result.has_e_flag()) {
                return val * start.multiplier() / result.multiplier();
            }
            if (start.has_e_flag()) {
                if (std::isnan(basis)) {
                    return (val * start.multiplier() +
                            precise::pressure::atm.multiplier()) /
                        result.multiplier();
                }
                return (val + basis) * start.multiplier() / result.multiplier();
            }
            if (std::isnan(basis)) {
                return (val * start.multiplier() -
                        precise::pressure::atm.multiplier()) /
                    result.multiplier();
            }
            return (val * start.multiplier() / result.multiplier()) - basis;
        }
        return constants::invalid_conversion;
    }